

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O2

void __thiscall
cmCTestBuildHandler::GenerateXMLLogScraped(cmCTestBuildHandler *this,cmXMLWriter *xml)

{
  RegularExpression *this_00;
  string *path;
  cmCTest *this_01;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  char *__s;
  pointer pcVar5;
  pointer pcVar6;
  int iVar7;
  int iVar8;
  cmAlphaNum local_f8;
  cmXMLWriter *local_c8;
  cmAlphaNum local_c0;
  string srcdir;
  string local_70;
  string local_50;
  
  iVar8 = this->MaxErrors;
  iVar7 = this->MaxWarnings;
  this_01 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"SourceDirectory",(allocator<char> *)&local_c0);
  cmCTest::GetCTestConfiguration(&srcdir,this_01,(string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  cmsys::SystemTools::CollapseFullPath(&local_70,&srcdir);
  local_f8.View_._M_len = local_70._M_string_length;
  local_f8.View_._M_str = local_70._M_dataplus._M_p;
  local_c0.View_._M_str = local_c0.Digits_;
  local_c0.View_._M_len = 1;
  local_c0.Digits_[0] = '/';
  cmStrCat<>(&local_50,&local_f8,&local_c0);
  std::__cxx11::string::operator=((string *)&srcdir,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  pcVar5 = (this->ErrorsAndWarnings).
           super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_c8 = xml;
  do {
    if ((pcVar5 == (this->ErrorsAndWarnings).
                   super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                   ._M_impl.super__Vector_impl_data._M_finish) || (iVar8 == 0 && iVar7 == 0)) {
      std::__cxx11::string::~string((string *)&srcdir);
      return;
    }
    bVar2 = pcVar5->Error;
    iVar3 = iVar7;
    if (bVar2 != false) {
      iVar3 = iVar8;
    }
    if (iVar3 != 0) {
      __s = "Warning";
      if (bVar2 != false) {
        __s = "Error";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,__s,(allocator<char> *)&local_c0);
      cmXMLWriter::StartElement(xml,(string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"BuildLogLine",(allocator<char> *)&local_c0);
      cmXMLWriter::Element<int>(xml,(string *)&local_f8,&pcVar5->LogLine);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"Text",(allocator<char> *)&local_c0);
      cmXMLWriter::Element<std::__cxx11::string>(xml,(string *)&local_f8,&pcVar5->Text);
      iVar7 = iVar7 - (uint)(bVar2 ^ 1);
      iVar8 = iVar8 - (uint)bVar2;
      std::__cxx11::string::~string((string *)&local_f8);
      pcVar1 = (this->ErrorWarningFileLineRegex).
               super__Vector_base<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pcVar6 = (this->ErrorWarningFileLineRegex).
                    super__Vector_base<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>
                    ._M_impl.super__Vector_impl_data._M_start; pcVar6 != pcVar1; pcVar6 = pcVar6 + 1
          ) {
        this_00 = &pcVar6->RegularExpression;
        bVar2 = cmsys::RegularExpression::find(this_00,&pcVar5->Text);
        if (bVar2) {
          cmsys::RegularExpressionMatch::match_abi_cxx11_
                    ((string *)&local_f8,&this_00->regmatch,pcVar6->FileIndex);
          path = &pcVar5->SourceFile;
          std::__cxx11::string::operator=((string *)path,(string *)&local_f8);
          std::__cxx11::string::~string((string *)&local_f8);
          cmsys::SystemTools::ConvertToUnixSlashes(path);
          lVar4 = std::__cxx11::string::find((char *)path,0x5ff8f7);
          if (lVar4 == -1) {
            cmsys::SystemTools::CollapseFullPath((string *)&local_f8,path);
            std::__cxx11::string::operator=((string *)path,(string *)&local_f8);
            std::__cxx11::string::~string((string *)&local_f8);
            cmsys::SystemTools::ReplaceString(path,srcdir._M_dataplus._M_p,"");
          }
          else {
            cmsys::SystemTools::ReplaceString(path,"/.../","");
            lVar4 = std::__cxx11::string::find((char)path,0x2f);
            if (lVar4 != -1) {
              std::__cxx11::string::substr((ulong)&local_f8,(ulong)path);
              std::__cxx11::string::operator=((string *)path,(string *)&local_f8);
              std::__cxx11::string::~string((string *)&local_f8);
            }
          }
          cmsys::RegularExpressionMatch::match_abi_cxx11_
                    ((string *)&local_f8,&this_00->regmatch,pcVar6->LineIndex);
          iVar3 = atoi((char *)local_f8.View_._M_len);
          pcVar5->LineNumber = iVar3;
          std::__cxx11::string::~string((string *)&local_f8);
          break;
        }
      }
      xml = local_c8;
      if (((pcVar5->SourceFile)._M_string_length != 0) && (-1 < pcVar5->LineNumber)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f8,"SourceFile",(allocator<char> *)&local_c0);
        cmXMLWriter::Element<std::__cxx11::string>(xml,(string *)&local_f8,&pcVar5->SourceFile);
        std::__cxx11::string::~string((string *)&local_f8);
        if ((pcVar5->SourceFileTail)._M_string_length != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f8,"SourceFileTail",(allocator<char> *)&local_c0);
          cmXMLWriter::Element<std::__cxx11::string>
                    (xml,(string *)&local_f8,&pcVar5->SourceFileTail);
          std::__cxx11::string::~string((string *)&local_f8);
        }
        if (-1 < pcVar5->LineNumber) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f8,"SourceLineNumber",(allocator<char> *)&local_c0);
          cmXMLWriter::Element<int>(xml,(string *)&local_f8,&pcVar5->LineNumber);
          std::__cxx11::string::~string((string *)&local_f8);
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"PreContext",(allocator<char> *)&local_c0);
      cmXMLWriter::Element<std::__cxx11::string>(xml,(string *)&local_f8,&pcVar5->PreContext);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"PostContext",(allocator<char> *)&local_c0);
      cmXMLWriter::StartElement(xml,(string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      cmXMLWriter::Content<std::__cxx11::string>(xml,&pcVar5->PostContext);
      iVar3 = iVar7;
      if (pcVar5->Error != false) {
        iVar3 = iVar8;
      }
      if (iVar3 == 0) {
        cmXMLWriter::Content<char[72]>
                  (xml,(char (*) [72])
                       "\nThe maximum number of reported warnings or errors has been reached!!!\n");
      }
      cmXMLWriter::EndElement(xml);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"RepeatCount",(allocator<char> *)&local_c0);
      cmXMLWriter::Element<char[2]>(xml,(string *)&local_f8,(char (*) [2])0x634647);
      std::__cxx11::string::~string((string *)&local_f8);
      cmXMLWriter::EndElement(xml);
    }
    pcVar5 = pcVar5 + 1;
  } while( true );
}

Assistant:

void cmCTestBuildHandler::GenerateXMLLogScraped(cmXMLWriter& xml)
{
  std::vector<cmCTestBuildErrorWarning>& ew = this->ErrorsAndWarnings;
  std::vector<cmCTestBuildErrorWarning>::iterator it;

  // only report the first 50 warnings and first 50 errors
  int numErrorsAllowed = this->MaxErrors;
  int numWarningsAllowed = this->MaxWarnings;
  std::string srcdir = this->CTest->GetCTestConfiguration("SourceDirectory");
  // make sure the source dir is in the correct case on windows
  // via a call to collapse full path.
  srcdir = cmStrCat(cmSystemTools::CollapseFullPath(srcdir), '/');
  for (it = ew.begin();
       it != ew.end() && (numErrorsAllowed || numWarningsAllowed); it++) {
    cmCTestBuildErrorWarning* cm = &(*it);
    if ((cm->Error && numErrorsAllowed) ||
        (!cm->Error && numWarningsAllowed)) {
      if (cm->Error) {
        numErrorsAllowed--;
      } else {
        numWarningsAllowed--;
      }
      xml.StartElement(cm->Error ? "Error" : "Warning");
      xml.Element("BuildLogLine", cm->LogLine);
      xml.Element("Text", cm->Text);
      for (cmCTestCompileErrorWarningRex& rit :
           this->ErrorWarningFileLineRegex) {
        cmsys::RegularExpression* re = &rit.RegularExpression;
        if (re->find(cm->Text)) {
          cm->SourceFile = re->match(rit.FileIndex);
          // At this point we need to make this->SourceFile relative to
          // the source root of the project, so cvs links will work
          cmSystemTools::ConvertToUnixSlashes(cm->SourceFile);
          if (cm->SourceFile.find("/.../") != std::string::npos) {
            cmSystemTools::ReplaceString(cm->SourceFile, "/.../", "");
            std::string::size_type p = cm->SourceFile.find('/');
            if (p != std::string::npos) {
              cm->SourceFile =
                cm->SourceFile.substr(p + 1, cm->SourceFile.size() - p);
            }
          } else {
            // make sure it is a full path with the correct case
            cm->SourceFile = cmSystemTools::CollapseFullPath(cm->SourceFile);
            cmSystemTools::ReplaceString(cm->SourceFile, srcdir.c_str(), "");
          }
          cm->LineNumber = atoi(re->match(rit.LineIndex).c_str());
          break;
        }
      }
      if (!cm->SourceFile.empty() && cm->LineNumber >= 0) {
        if (!cm->SourceFile.empty()) {
          xml.Element("SourceFile", cm->SourceFile);
        }
        if (!cm->SourceFileTail.empty()) {
          xml.Element("SourceFileTail", cm->SourceFileTail);
        }
        if (cm->LineNumber >= 0) {
          xml.Element("SourceLineNumber", cm->LineNumber);
        }
      }
      xml.Element("PreContext", cm->PreContext);
      xml.StartElement("PostContext");
      xml.Content(cm->PostContext);
      // is this the last warning or error, if so notify
      if ((cm->Error && !numErrorsAllowed) ||
          (!cm->Error && !numWarningsAllowed)) {
        xml.Content("\nThe maximum number of reported warnings or errors "
                    "has been reached!!!\n");
      }
      xml.EndElement(); // PostContext
      xml.Element("RepeatCount", "0");
      xml.EndElement(); // "Error" / "Warning"
    }
  }
}